

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::end_examples(search *sch)

{
  search_private *psVar1;
  vw *pvVar2;
  options_i *poVar3;
  typed_option<unsigned_int> *ptVar4;
  uint __val;
  allocator local_61;
  string local_60;
  string local_40;
  
  psVar1 = sch->priv;
  pvVar2 = psVar1->all;
  if (pvVar2->training == true) {
    __val = (psVar1->current_policy + 1) - (uint)(psVar1->passes_since_new_policy == 0);
    poVar3 = pvVar2->options;
    std::__cxx11::string::string((string *)&local_60,"search_trained_nb_policies",&local_61);
    std::__cxx11::to_string(&local_40,__val);
    (*poVar3->_vptr_options_i[6])(poVar3,&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    poVar3 = pvVar2->options;
    std::__cxx11::string::string
              ((string *)&local_60,"search_trained_nb_policies",(allocator *)&local_40);
    ptVar4 = VW::config::options_i::get_typed_option<unsigned_int>(poVar3,&local_60);
    VW::config::typed_option<unsigned_int>::value(ptVar4,__val);
    std::__cxx11::string::~string((string *)&local_60);
    poVar3 = pvVar2->options;
    std::__cxx11::string::string((string *)&local_60,"search_total_nb_policies",&local_61);
    std::__cxx11::to_string(&local_40,psVar1->total_number_of_policies);
    (*poVar3->_vptr_options_i[6])(poVar3,&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    poVar3 = pvVar2->options;
    std::__cxx11::string::string
              ((string *)&local_60,"search_total_nb_policies",(allocator *)&local_40);
    ptVar4 = VW::config::options_i::get_typed_option<unsigned_int>(poVar3,&local_60);
    VW::config::typed_option<unsigned_int>::value(ptVar4,psVar1->total_number_of_policies);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void end_examples(search& sch)
{
  search_private& priv = *sch.priv;
  vw* all = priv.all;

  if (all->training)
  {
    // TODO work out a better system to update state that will be saved in the model.
    // Dig out option and change it in case we already loaded a predictor which had a value stored for
    // --search_trained_nb_policies
    auto val = (priv.passes_since_new_policy == 0) ? priv.current_policy : (priv.current_policy + 1);
    all->options->replace("search_trained_nb_policies", std::to_string(val));
    all->options->get_typed_option<uint32_t>("search_trained_nb_policies").value(val);
    // Dig out option and change it in case we already loaded a predictor which had a value stored for
    // --search_total_nb_policies
    all->options->replace("search_total_nb_policies", std::to_string(priv.total_number_of_policies));
    all->options->get_typed_option<uint32_t>("search_total_nb_policies").value(priv.total_number_of_policies);
  }
}